

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

_Bool url_match_conn(connectdata *conn,void *userdata)

{
  Curl_llist *list;
  uchar uVar1;
  ConnectBits CVar2;
  Curl_easy *data;
  long lVar3;
  curl_trc_feat *pcVar4;
  _Bool _Var5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  Curl_llist_node *n;
  void *pvVar10;
  ulong uVar11;
  undefined8 *puVar12;
  size_t sVar13;
  long lVar14;
  char *pcVar15;
  bool bVar16;
  
  if (conn->connect_only != '\0') {
    return false;
  }
  CVar2 = conn->bits;
  if (((ulong)CVar2 & 0x20) != 0) {
    return false;
  }
  data = *(Curl_easy **)((long)userdata + 8);
  lVar3 = *(long *)((long)userdata + 0x10);
  uVar1 = (data->set).ipver;
  if ((uVar1 != '\0') && (uVar1 != conn->ip_version)) {
    return false;
  }
  pcVar15 = *(char **)(lVar3 + 0x560);
  if (pcVar15 != (char *)0x0 || *(unsigned_short *)(lVar3 + 0x57c) != 0) {
    if (conn->localport != *(unsigned_short *)(lVar3 + 0x57c)) {
      return false;
    }
    if (conn->localportrange != *(unsigned_short *)(lVar3 + 0x568)) {
      return false;
    }
    if (pcVar15 != (char *)0x0) {
      if (conn->localdev == (char *)0x0) {
        return false;
      }
      iVar7 = strcmp(conn->localdev,pcVar15);
      if (iVar7 != 0) {
        return false;
      }
    }
  }
  if (((CVar2._0_4_ ^ *(uint *)(lVar3 + 0x3b8)) & 0x300) != 0) {
    return false;
  }
  _Var5 = Curl_conn_is_connected(conn,0);
  if ((_Var5) && (((conn->bits).field_0x2 & 0x20) == 0)) {
    list = &conn->easyq;
    sVar9 = Curl_llist_count(list);
    if (sVar9 != 0) {
      bVar6 = *(byte *)((long)userdata + 0x18);
      if (((conn->bits).field_0x2 & 0x40) == 0) {
        *(byte *)((long)userdata + 0x18) = bVar6 | 0x40;
        return false;
      }
      *(byte *)((long)userdata + 0x18) = bVar6 | 0x80;
      if ((bVar6 & 1) == 0) {
        return false;
      }
      n = Curl_llist_head(list);
      pvVar10 = Curl_node_elem(n);
      if (*(Curl_multi **)((long)pvVar10 + 0xd0) != data->multi) {
        return false;
      }
    }
    pcVar15 = conn->unix_domain_socket;
    if (*(char **)(lVar3 + 0x558) == (char *)0x0) {
      if (pcVar15 != (char *)0x0) {
        return false;
      }
    }
    else {
      if (pcVar15 == (char *)0x0) {
        return false;
      }
      iVar7 = strcmp(*(char **)(lVar3 + 0x558),pcVar15);
      if (iVar7 != 0) {
        return false;
      }
      if (((*(uint *)&conn->bits ^ *(uint *)(lVar3 + 0x3b8)) >> 0x1a & 1) != 0) {
        return false;
      }
    }
    if (((conn->handler->flags ^ *(uint *)(*(long *)(lVar3 + 0x3c0) + 0x94)) & 1) == 0) {
      uVar8 = SUB84(conn->bits,0);
    }
    else {
      if (conn->handler->family != *(curl_prot_t *)(*(long *)(lVar3 + 0x3c0) + 0x8c)) {
        return false;
      }
      uVar8 = SUB84(conn->bits,0);
      if ((uVar8 >> 0x1b & 1) == 0) {
        return false;
      }
    }
    uVar11 = *(ulong *)(lVar3 + 0x3b8);
    if ((((uint)uVar11 ^ uVar8) & 1) != 0) {
      return false;
    }
    if (((uint)(uVar11 >> 1) & 1) != (uint)((uVar8 >> 1 & 1) != 0)) {
      return false;
    }
    if ((uVar11 >> 1 & 1) != 0) {
      _Var5 = proxy_info_matches((proxy_info *)(lVar3 + 0xa8),&conn->socks_proxy);
      if (!_Var5) {
        return false;
      }
      iVar7 = Curl_timestrcmp(*(char **)(lVar3 + 0xd0),(conn->socks_proxy).user);
      if (iVar7 != 0) {
        return false;
      }
      iVar7 = Curl_timestrcmp(*(char **)(lVar3 + 0xd8),(conn->socks_proxy).passwd);
      if (iVar7 != 0) {
        return false;
      }
      uVar11 = *(ulong *)(lVar3 + 0x3b8);
    }
    if ((uVar11 & 1) != 0) {
      if ((((uint)uVar11 ^ *(uint *)&conn->bits) & 8) != 0) {
        return false;
      }
      _Var5 = proxy_info_matches((proxy_info *)(lVar3 + 0xe0),&conn->http_proxy);
      if (!_Var5) {
        return false;
      }
      if ((*(byte *)(lVar3 + 0x104) & 0xfe) == 2) {
        if (*(byte *)(lVar3 + 0x104) != (conn->http_proxy).proxytype) {
          return false;
        }
        _Var5 = Curl_ssl_conn_config_match(data,conn,true);
        if (!_Var5) {
          return false;
        }
      }
    }
    bVar6 = *(byte *)((long)userdata + 0x18);
    if ((bVar6 & 1) == 0) {
      lVar14 = *(long *)(lVar3 + 0x3c0);
    }
    else {
      lVar14 = *(long *)(lVar3 + 0x3c0);
      if ((((data->state).httpwant == '\x03') && ((*(byte *)(lVar14 + 0x8c) & 1) != 0)) &&
         (conn->httpversion == '\0')) {
        uVar11 = *(ulong *)&(data->set).field_0x8ca;
        uVar8 = (uint)uVar11;
        if ((uVar11 >> 0x2a & 1) == 0) {
          if ((uVar8 >> 0x1c & 1) == 0) {
            return false;
          }
          pcVar4 = (data->state).feat;
          if ((pcVar4 != (curl_trc_feat *)0x0) && (pcVar4->log_level < 1)) {
            return false;
          }
          Curl_infof(data,"Server upgrade cannot be used");
          return false;
        }
        if (((uVar8 >> 0x1c & 1) != 0) &&
           ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))
           )) {
          Curl_infof(data,"Server upgrade does not support multiplex yet, wait");
          bVar6 = *(byte *)((long)userdata + 0x18);
        }
        *(undefined8 *)userdata = 0;
        bVar6 = bVar6 | 8;
        goto LAB_0015cf70;
      }
    }
    if ((*(byte *)(lVar14 + 0x94) & 0x80) == 0) {
      iVar7 = Curl_timestrcmp(*(char **)(lVar3 + 0x1e0),conn->user);
      if (iVar7 != 0) {
        return false;
      }
      iVar7 = Curl_timestrcmp(*(char **)(lVar3 + 0x1e8),conn->passwd);
      if (iVar7 != 0) {
        return false;
      }
      iVar7 = Curl_timestrcmp(*(char **)(lVar3 + 0x1f8),conn->sasl_authzid);
      if (iVar7 != 0) {
        return false;
      }
      iVar7 = Curl_timestrcmp(*(char **)(lVar3 + 0x200),conn->oauth_bearer);
      if (iVar7 != 0) {
        return false;
      }
    }
    if (*(uchar *)(lVar3 + 0x586) != conn->gssapi_delegation) {
      return false;
    }
    puVar12 = *(undefined8 **)(lVar3 + 0x3c0);
    if (((*(uint *)((long)puVar12 + 0x8c) & 0xc0000003) == 0) ||
       (bVar6 = (data->state).httpwant, bVar6 == 4)) {
      if ((*(byte *)(puVar12 + 0x12) & 0xc) != 0) {
        iVar7 = Curl_timestrcmp(*(char **)(lVar3 + 0x4e0),(conn->proto).ftpc.account);
        if (iVar7 != 0) {
          return false;
        }
        iVar7 = Curl_timestrcmp(*(char **)(lVar3 + 0x4e8),(conn->proto).ftpc.alternative_to_user);
        if (iVar7 != 0) {
          return false;
        }
        if (*(uchar *)(lVar3 + 0x550) != (conn->proto).ftpc.use_ssl) {
          return false;
        }
        if (*(uchar *)(lVar3 + 0x551) != (conn->proto).ftpc.ccc) {
          return false;
        }
        puVar12 = *(undefined8 **)(lVar3 + 0x3c0);
      }
    }
    else if ((bVar6 < 0x1e) && (0x1d < conn->httpversion)) {
      return false;
    }
    if (((*(byte *)((long)puVar12 + 0x94) & 1) != 0) || ((*(uint *)(lVar3 + 0x3b8) & 9) != 1)) {
      iVar7 = curl_strequal((char *)*puVar12,conn->handler->scheme);
      if (iVar7 == 0) {
        if (conn->handler->family != *(curl_prot_t *)(*(long *)(lVar3 + 0x3c0) + 0x8c)) {
          return false;
        }
        if (((conn->bits).field_0x3 & 8) == 0) {
          return false;
        }
      }
      uVar8 = (uint)*(undefined8 *)(lVar3 + 0x3b8);
      if ((uVar8 >> 8 & 1) != 0) {
        iVar7 = curl_strequal(*(char **)(lVar3 + 0x98),(conn->conn_to_host).name);
        if (iVar7 == 0) {
          return false;
        }
        uVar8 = (uint)*(undefined8 *)(lVar3 + 0x3b8);
      }
      if (((uVar8 >> 9 & 1) != 0) && (*(int *)(lVar3 + 0x574) != conn->conn_to_port)) {
        return false;
      }
      iVar7 = curl_strequal(*(char **)(lVar3 + 0x68),(conn->host).name);
      if (iVar7 == 0) {
        return false;
      }
      if (*(int *)(lVar3 + 0x570) != conn->remote_port) {
        return false;
      }
      if (((*(byte *)(*(long *)(lVar3 + 0x3c0) + 0x94) & 1) != 0) &&
         (_Var5 = Curl_ssl_conn_config_match(data,conn,false), !_Var5)) {
        return false;
      }
    }
    bVar6 = *(byte *)((long)userdata + 0x18);
    if ((bVar6 & 2) == 0) {
      if (conn->http_ntlm_state != NTLMSTATE_NONE) {
        return false;
      }
    }
    else {
      iVar7 = Curl_timestrcmp(*(char **)(lVar3 + 0x1e0),conn->user);
      if ((iVar7 != 0) ||
         (iVar7 = Curl_timestrcmp(*(char **)(lVar3 + 0x1e8),conn->passwd), iVar7 != 0)) {
        if (conn->http_ntlm_state != NTLMSTATE_NONE) {
          return false;
        }
        *(connectdata **)userdata = conn;
        return false;
      }
      bVar6 = *(byte *)((long)userdata + 0x18);
    }
    if ((bVar6 & 4) == 0) {
      if (conn->proxy_ntlm_state != NTLMSTATE_NONE) {
        return false;
      }
      bVar16 = true;
    }
    else {
      pcVar15 = (conn->http_proxy).user;
      if (pcVar15 == (char *)0x0) {
        return false;
      }
      if ((conn->http_proxy).passwd == (char *)0x0) {
        return false;
      }
      iVar7 = Curl_timestrcmp(*(char **)(lVar3 + 0x108),pcVar15);
      if (iVar7 != 0) {
        return false;
      }
      iVar7 = Curl_timestrcmp(*(char **)(lVar3 + 0x110),(conn->http_proxy).passwd);
      if (iVar7 != 0) {
        return false;
      }
      bVar6 = *(byte *)((long)userdata + 0x18);
      bVar16 = (bVar6 & 4) == 0;
    }
    if ((bVar6 & 6) != 0) {
      *(connectdata **)userdata = conn;
      if (((bVar6 & 2) == 0) || (conn->http_ntlm_state == NTLMSTATE_NONE)) {
        if (bVar16) {
          return false;
        }
        if (conn->proxy_ntlm_state == NTLMSTATE_NONE) {
          return false;
        }
      }
      bVar6 = bVar6 | 0x10;
LAB_0015cf70:
      *(byte *)((long)userdata + 0x18) = bVar6;
      return true;
    }
    sVar9 = Curl_llist_count(list);
    if (sVar9 == 0) {
      _Var5 = Curl_conn_seems_dead(conn,data,(curltime *)0x0);
      if (_Var5) {
        Curl_cpool_disconnect(data,conn,false);
        return false;
      }
LAB_0015d110:
      *(connectdata **)userdata = conn;
      return true;
    }
    sVar9 = Curl_llist_count(list);
    uVar8 = Curl_multi_max_concurrent_streams(data->multi);
    if (sVar9 < uVar8) {
      sVar9 = Curl_llist_count(list);
      sVar13 = Curl_conn_get_max_concurrent(data,conn,0);
      uVar8 = (uint)*(undefined8 *)&(data->set).field_0x8ca;
      if (sVar9 < sVar13) {
        if (((uVar8 >> 0x1c & 1) != 0) &&
           ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))
           )) {
          Curl_infof(data,"Multiplexed connection found");
        }
        goto LAB_0015d110;
      }
      if ((uVar8 >> 0x1c & 1) == 0) {
        return false;
      }
      pcVar4 = (data->state).feat;
      if ((pcVar4 != (curl_trc_feat *)0x0) && (pcVar4->log_level < 1)) {
        return false;
      }
      sVar9 = Curl_llist_count(list);
      pcVar15 = "MAX_CONCURRENT_STREAMS reached, skip (%zu)";
    }
    else {
      if ((((data->set).field_0x8cd & 0x10) == 0) ||
         ((pcVar4 = (data->state).feat, pcVar4 != (curl_trc_feat *)0x0 && (pcVar4->log_level < 1))))
      {
        return false;
      }
      sVar9 = Curl_llist_count(list);
      pcVar15 = "client side MAX_CONCURRENT_STREAMS reached, skip (%zu)";
    }
  }
  else {
    if ((*(byte *)((long)userdata + 0x18) & 1) == 0) {
      return false;
    }
    *(byte *)((long)userdata + 0x18) = *(byte *)((long)userdata + 0x18) | 0x20;
    if (((data->set).field_0x8cd & 0x10) == 0) {
      return false;
    }
    pcVar4 = (data->state).feat;
    if ((pcVar4 != (curl_trc_feat *)0x0) && (pcVar4->log_level < 1)) {
      return false;
    }
    sVar9 = conn->connection_id;
    pcVar15 = "Connection #%ld is not open enough, cannot reuse";
  }
  Curl_infof(data,pcVar15,sVar9);
  return false;
}

Assistant:

static bool url_match_conn(struct connectdata *conn, void *userdata)
{
  struct url_conn_match *match = userdata;
  struct Curl_easy *data = match->data;
  struct connectdata *needle = match->needle;

  /* Check if `conn` can be used for transfer `data` */

  if(conn->connect_only || conn->bits.close)
    /* connect-only or to-be-closed connections will not be reused */
    return FALSE;

  if(data->set.ipver != CURL_IPRESOLVE_WHATEVER
     && data->set.ipver != conn->ip_version) {
    /* skip because the connection is not via the requested IP version */
    return FALSE;
  }

  if(needle->localdev || needle->localport) {
    /* If we are bound to a specific local end (IP+port), we must not
       reuse a random other one, although if we did not ask for a
       particular one we can reuse one that was bound.

       This comparison is a bit rough and too strict. Since the input
       parameters can be specified in numerous ways and still end up the
       same it would take a lot of processing to make it really accurate.
       Instead, this matching will assume that reuses of bound connections
       will most likely also reuse the exact same binding parameters and
       missing out a few edge cases should not hurt anyone very much.
    */
    if((conn->localport != needle->localport) ||
       (conn->localportrange != needle->localportrange) ||
       (needle->localdev &&
        (!conn->localdev || strcmp(conn->localdev, needle->localdev))))
      return FALSE;
  }

  if(needle->bits.conn_to_host != conn->bits.conn_to_host)
    /* do not mix connections that use the "connect to host" feature and
     * connections that do not use this feature */
    return FALSE;

  if(needle->bits.conn_to_port != conn->bits.conn_to_port)
    /* do not mix connections that use the "connect to port" feature and
     * connections that do not use this feature */
    return FALSE;

  if(!Curl_conn_is_connected(conn, FIRSTSOCKET) ||
     conn->bits.asks_multiplex) {
    /* Not yet connected, or not yet decided if it multiplexes. The later
     * happens for HTTP/2 Upgrade: requests that need a response. */
    if(match->may_multiplex) {
      match->seen_pending_conn = TRUE;
      /* Do not pick a connection that has not connected yet */
      infof(data, "Connection #%" FMT_OFF_T
            " is not open enough, cannot reuse", conn->connection_id);
    }
    /* Do not pick a connection that has not connected yet */
    return FALSE;
  }
  /* `conn` is connected. If it has transfers, can we add ours to it? */

  if(CONN_INUSE(conn)) {
    if(!conn->bits.multiplex) {
      /* conn busy and conn cannot take more transfers */
      match->seen_single_use_conn = TRUE;
      return FALSE;
    }
    match->seen_multiplex_conn = TRUE;
    if(!match->may_multiplex)
      /* conn busy and transfer cannot be multiplexed */
      return FALSE;
    else {
      /* transfer and conn multiplex. Are they on the same multi? */
      struct Curl_llist_node *e = Curl_llist_head(&conn->easyq);
      struct Curl_easy *entry = Curl_node_elem(e);
      if(entry->multi != data->multi)
        return FALSE;
    }
  }
  /* `conn` is connected and we could add the transfer to it, if
   * all the other criteria do match. */

  /* Does `conn` use the correct protocol? */
#ifdef USE_UNIX_SOCKETS
  if(needle->unix_domain_socket) {
    if(!conn->unix_domain_socket)
      return FALSE;
    if(strcmp(needle->unix_domain_socket, conn->unix_domain_socket))
      return FALSE;
    if(needle->bits.abstract_unix_socket != conn->bits.abstract_unix_socket)
      return FALSE;
  }
  else if(conn->unix_domain_socket)
    return FALSE;
#endif

  if((needle->handler->flags&PROTOPT_SSL) !=
     (conn->handler->flags&PROTOPT_SSL))
    /* do not do mixed SSL and non-SSL connections */
    if(get_protocol_family(conn->handler) !=
       needle->handler->protocol || !conn->bits.tls_upgraded)
      /* except protocols that have been upgraded via TLS */
      return FALSE;

#ifndef CURL_DISABLE_PROXY
  if(needle->bits.httpproxy != conn->bits.httpproxy ||
     needle->bits.socksproxy != conn->bits.socksproxy)
    return FALSE;

  if(needle->bits.socksproxy &&
    !socks_proxy_info_matches(&needle->socks_proxy,
                              &conn->socks_proxy))
    return FALSE;

  if(needle->bits.httpproxy) {
    if(needle->bits.tunnel_proxy != conn->bits.tunnel_proxy)
      return FALSE;

    if(!proxy_info_matches(&needle->http_proxy, &conn->http_proxy))
      return FALSE;

    if(IS_HTTPS_PROXY(needle->http_proxy.proxytype)) {
      /* https proxies come in different types, http/1.1, h2, ... */
      if(needle->http_proxy.proxytype != conn->http_proxy.proxytype)
        return FALSE;
      /* match SSL config to proxy */
      if(!Curl_ssl_conn_config_match(data, conn, TRUE)) {
        DEBUGF(infof(data,
          "Connection #%" FMT_OFF_T
          " has different SSL proxy parameters, cannot reuse",
          conn->connection_id));
        return FALSE;
      }
      /* the SSL config to the server, which may apply here is checked
       * further below */
    }
  }
#endif

  if(match->may_multiplex &&
     (data->state.httpwant == CURL_HTTP_VERSION_2_0) &&
     (needle->handler->protocol & CURLPROTO_HTTP) &&
     !conn->httpversion) {
    if(data->set.pipewait) {
      infof(data, "Server upgrade does not support multiplex yet, wait");
      match->found = NULL;
      match->wait_pipe = TRUE;
      return TRUE; /* stop searching, we want to wait */
    }
    infof(data, "Server upgrade cannot be used");
    return FALSE;
  }

  if(!(needle->handler->flags & PROTOPT_CREDSPERREQUEST)) {
    /* This protocol requires credentials per connection,
       so verify that we are using the same name and password as well */
    if(Curl_timestrcmp(needle->user, conn->user) ||
       Curl_timestrcmp(needle->passwd, conn->passwd) ||
       Curl_timestrcmp(needle->sasl_authzid, conn->sasl_authzid) ||
       Curl_timestrcmp(needle->oauth_bearer, conn->oauth_bearer)) {
      /* one of them was different */
      return FALSE;
    }
  }

  /* GSS delegation differences do not actually affect every connection
     and auth method, but this check takes precaution before efficiency */
  if(needle->gssapi_delegation != conn->gssapi_delegation)
    return FALSE;

  /* If looking for HTTP and the HTTP version we want is less
   * than the HTTP version of conn, continue looking.
   * CURL_HTTP_VERSION_2TLS is default which indicates no preference,
   * so we take any existing connection. */
  if((needle->handler->protocol & PROTO_FAMILY_HTTP) &&
     (data->state.httpwant != CURL_HTTP_VERSION_2TLS)) {
    if((conn->httpversion >= 20) &&
       (data->state.httpwant < CURL_HTTP_VERSION_2_0)) {
      DEBUGF(infof(data, "nor reusing conn #%" CURL_FORMAT_CURL_OFF_T
             " with httpversion=%d, we want a version less than h2",
             conn->connection_id, conn->httpversion));
    }
    if((conn->httpversion >= 30) &&
       (data->state.httpwant < CURL_HTTP_VERSION_3)) {
      DEBUGF(infof(data, "nor reusing conn #%" CURL_FORMAT_CURL_OFF_T
             " with httpversion=%d, we want a version less than h3",
             conn->connection_id, conn->httpversion));
      return FALSE;
    }
  }
#ifdef USE_SSH
  else if(get_protocol_family(needle->handler) & PROTO_FAMILY_SSH) {
    if(!ssh_config_matches(needle, conn))
      return FALSE;
  }
#endif
#ifndef CURL_DISABLE_FTP
  else if(get_protocol_family(needle->handler) & PROTO_FAMILY_FTP) {
    /* Also match ACCOUNT, ALTERNATIVE-TO-USER, USE_SSL and CCC options */
    if(Curl_timestrcmp(needle->proto.ftpc.account,
                       conn->proto.ftpc.account) ||
       Curl_timestrcmp(needle->proto.ftpc.alternative_to_user,
                       conn->proto.ftpc.alternative_to_user) ||
       (needle->proto.ftpc.use_ssl != conn->proto.ftpc.use_ssl) ||
       (needle->proto.ftpc.ccc != conn->proto.ftpc.ccc))
      return FALSE;
  }
#endif

  /* Additional match requirements if talking TLS OR
   * not talking to an HTTP proxy OR using a tunnel through a proxy */
  if((needle->handler->flags&PROTOPT_SSL)
#ifndef CURL_DISABLE_PROXY
     || !needle->bits.httpproxy || needle->bits.tunnel_proxy
#endif
    ) {
    /* Talking the same protocol scheme or a TLS upgraded protocol in the
     * same protocol family? */
    if(!strcasecompare(needle->handler->scheme, conn->handler->scheme) &&
       (get_protocol_family(conn->handler) !=
        needle->handler->protocol || !conn->bits.tls_upgraded))
      return FALSE;

    /* If needle has "conn_to_*" set, conn must match this */
    if((needle->bits.conn_to_host && !strcasecompare(
        needle->conn_to_host.name, conn->conn_to_host.name)) ||
       (needle->bits.conn_to_port &&
         needle->conn_to_port != conn->conn_to_port))
      return FALSE;

    /* hostname and port must match */
    if(!strcasecompare(needle->host.name, conn->host.name) ||
       needle->remote_port != conn->remote_port)
      return FALSE;

    /* If talking TLS, conn needs to use the same SSL options. */
    if((needle->handler->flags & PROTOPT_SSL) &&
       !Curl_ssl_conn_config_match(data, conn, FALSE)) {
      DEBUGF(infof(data,
                   "Connection #%" FMT_OFF_T
                   " has different SSL parameters, cannot reuse",
                   conn->connection_id));
      return FALSE;
    }
  }

#if defined(USE_NTLM)
  /* If we are looking for an HTTP+NTLM connection, check if this is
     already authenticating with the right credentials. If not, keep
     looking so that we can reuse NTLM connections if
     possible. (Especially we must not reuse the same connection if
     partway through a handshake!) */
  if(match->want_ntlm_http) {
    if(Curl_timestrcmp(needle->user, conn->user) ||
       Curl_timestrcmp(needle->passwd, conn->passwd)) {

      /* we prefer a credential match, but this is at least a connection
         that can be reused and "upgraded" to NTLM */
      if(conn->http_ntlm_state == NTLMSTATE_NONE)
        match->found = conn;
      return FALSE;
    }
  }
  else if(conn->http_ntlm_state != NTLMSTATE_NONE) {
    /* Connection is using NTLM auth but we do not want NTLM */
    return FALSE;
  }

#ifndef CURL_DISABLE_PROXY
  /* Same for Proxy NTLM authentication */
  if(match->want_proxy_ntlm_http) {
    /* Both conn->http_proxy.user and conn->http_proxy.passwd can be
     * NULL */
    if(!conn->http_proxy.user || !conn->http_proxy.passwd)
      return FALSE;

    if(Curl_timestrcmp(needle->http_proxy.user,
                       conn->http_proxy.user) ||
       Curl_timestrcmp(needle->http_proxy.passwd,
                       conn->http_proxy.passwd))
      return FALSE;
  }
  else if(conn->proxy_ntlm_state != NTLMSTATE_NONE) {
    /* Proxy connection is using NTLM auth but we do not want NTLM */
    return FALSE;
  }
#endif
  if(match->want_ntlm_http || match->want_proxy_ntlm_http) {
    /* Credentials are already checked, we may use this connection.
     * With NTLM being weird as it is, we MUST use a
     * connection where it has already been fully negotiated.
     * If it has not, we keep on looking for a better one. */
    match->found = conn;

    if((match->want_ntlm_http &&
       (conn->http_ntlm_state != NTLMSTATE_NONE)) ||
        (match->want_proxy_ntlm_http &&
         (conn->proxy_ntlm_state != NTLMSTATE_NONE))) {
      /* We must use this connection, no other */
      match->force_reuse = TRUE;
      return TRUE;
    }
    /* Continue look up for a better connection */
    return FALSE;
  }
#endif

  if(CONN_INUSE(conn)) {
    DEBUGASSERT(match->may_multiplex);
    DEBUGASSERT(conn->bits.multiplex);
    /* If multiplexed, make sure we do not go over concurrency limit */
    if(CONN_INUSE(conn) >=
            Curl_multi_max_concurrent_streams(data->multi)) {
      infof(data, "client side MAX_CONCURRENT_STREAMS reached"
            ", skip (%zu)", CONN_INUSE(conn));
      return FALSE;
    }
    if(CONN_INUSE(conn) >=
            Curl_conn_get_max_concurrent(data, conn, FIRSTSOCKET)) {
      infof(data, "MAX_CONCURRENT_STREAMS reached, skip (%zu)",
            CONN_INUSE(conn));
      return FALSE;
    }
    /* When not multiplexed, we have a match here! */
    infof(data, "Multiplexed connection found");
  }
  else if(Curl_conn_seems_dead(conn, data, NULL)) {
    /* removed and disconnect. Do not treat as aborted. */
    Curl_cpool_disconnect(data, conn, FALSE);
    return FALSE;
  }

  /* We have found a connection. Let's stop searching. */
  match->found = conn;
  return TRUE;
}